

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

bool el::base::utils::File::createPath(string *path)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  string builtPath;
  
  if (path->_M_string_length == 0) {
    bVar4 = false;
  }
  else {
    bVar1 = pathExists((path->_M_dataplus)._M_p,false);
    bVar4 = true;
    if (!bVar1) {
      pcVar3 = (path->_M_dataplus)._M_p;
      builtPath._M_dataplus._M_p = (pointer)&builtPath.field_2;
      builtPath._M_string_length = 0;
      builtPath.field_2._M_local_buf[0] = '\0';
      if (*pcVar3 == '/') {
        std::__cxx11::string::assign((char *)&builtPath);
      }
      pcVar3 = strtok(pcVar3,"/");
      iVar2 = -1;
      while (pcVar3 != (char *)0x0) {
        std::__cxx11::string::append((char *)&builtPath);
        std::__cxx11::string::append((char *)&builtPath);
        iVar2 = mkdir(builtPath._M_dataplus._M_p,0x1fb);
        pcVar3 = strtok((char *)0x0,"/");
      }
      bVar4 = iVar2 != -1;
      std::__cxx11::string::~string((string *)&builtPath);
    }
  }
  return bVar4;
}

Assistant:

inline void lock(void) {
#  if ELPP_OS_UNIX
    pthread_mutex_lock(&m_underlyingMutex);
#  elif ELPP_OS_WINDOWS
    EnterCriticalSection(&m_underlyingMutex);
#  endif  // ELPP_OS_UNIX
  }